

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

bool spvtools::val::anon_unknown_0::IsAllowedSampledImageOperand(Op opcode,ValidationState_t *_)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = opcode - OpStore;
  if (uVar2 < 0x2c) {
    if ((0x84dff200000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
      return true;
    }
    if ((ulong)uVar2 == 0) {
      bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,BindlessTextureNV);
      return bVar1;
    }
  }
  if (((0x17 < opcode - OpImageSampleWeightedQCOM) ||
      ((0xf0000fU >> (opcode - OpImageSampleWeightedQCOM & 0x1f) & 1) == 0)) &&
     ((10 < opcode - OpImageSparseSampleImplicitLod ||
      ((0x60fU >> (opcode - OpImageSparseSampleImplicitLod & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool IsAllowedSampledImageOperand(spv::Op opcode, ValidationState_t& _) {
  switch (opcode) {
    case spv::Op::OpSampledImage:
    case spv::Op::OpImageSampleImplicitLod:
    case spv::Op::OpImageSampleExplicitLod:
    case spv::Op::OpImageSampleDrefImplicitLod:
    case spv::Op::OpImageSampleDrefExplicitLod:
    case spv::Op::OpImageSampleProjImplicitLod:
    case spv::Op::OpImageSampleProjExplicitLod:
    case spv::Op::OpImageSampleProjDrefImplicitLod:
    case spv::Op::OpImageSampleProjDrefExplicitLod:
    case spv::Op::OpImageGather:
    case spv::Op::OpImageDrefGather:
    case spv::Op::OpImage:
    case spv::Op::OpImageQueryLod:
    case spv::Op::OpImageSparseSampleImplicitLod:
    case spv::Op::OpImageSparseSampleExplicitLod:
    case spv::Op::OpImageSparseSampleDrefImplicitLod:
    case spv::Op::OpImageSparseSampleDrefExplicitLod:
    case spv::Op::OpImageSparseGather:
    case spv::Op::OpImageSparseDrefGather:
    case spv::Op::OpCopyObject:
    case spv::Op::OpImageSampleWeightedQCOM:
    case spv::Op::OpImageBoxFilterQCOM:
    case spv::Op::OpImageBlockMatchSSDQCOM:
    case spv::Op::OpImageBlockMatchSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSADQCOM:
    case spv::Op::OpImageBlockMatchWindowSSDQCOM:
    case spv::Op::OpImageBlockMatchGatherSADQCOM:
    case spv::Op::OpImageBlockMatchGatherSSDQCOM:
      return true;
    case spv::Op::OpStore:
      if (_.HasCapability(spv::Capability::BindlessTextureNV)) return true;
      return false;
    default:
      return false;
  }
}